

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int main(void)

{
  uint uVar1;
  size_t sVar2;
  int n_1;
  int r;
  int n;
  char local_32;
  less<int> local_31;
  undefined1 local_30 [6];
  char c;
  priority_queue<int,_std::less<int>_> pq;
  
  pq._28_4_ = 0;
  CP::priority_queue<int,_std::less<int>_>::priority_queue
            ((priority_queue<int,_std::less<int>_> *)local_30,&local_31);
  __isoc99_scanf("%c",&local_32);
  while (local_32 != 'q') {
    if (local_32 == 'a') {
      __isoc99_scanf("%d",&n_1);
      CP::priority_queue<int,_std::less<int>_>::push
                ((priority_queue<int,_std::less<int>_> *)local_30,&n_1);
    }
    else if (local_32 == 'h') {
      uVar1 = CP::priority_queue<int,_std::less<int>_>::height
                        ((priority_queue<int,_std::less<int>_> *)local_30);
      sVar2 = CP::priority_queue<int,_std::less<int>_>::size
                        ((priority_queue<int,_std::less<int>_> *)local_30);
      printf("Binary Heap with %d nodes has height %d\n",sVar2 & 0xffffffff,(ulong)uVar1);
    }
    else if (local_32 == 'd') {
      CP::priority_queue<int,_std::less<int>_>::pop
                ((priority_queue<int,_std::less<int>_> *)local_30);
    }
    __isoc99_scanf("%c",&local_32);
  }
  pq._28_4_ = 0;
  CP::priority_queue<int,_std::less<int>_>::~priority_queue
            ((priority_queue<int,_std::less<int>_> *)local_30);
  return pq._28_4_;
}

Assistant:

int main() {
  CP::priority_queue<int> pq;
  char c;
  scanf("%c", &c);
  while (c != 'q') {
    if (c == 'a') {
      // add data
      int n;
      scanf("%d", &n);
      pq.push(n);
    } else if (c == 'h') {
      int r = pq.height();
      int n = pq.size();
      printf("Binary Heap with %d nodes has height %d\n",n,r);
    } else if (c == 'd') {
       pq.pop();
    }
    scanf("%c", &c);
  }
  return 0;
}